

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O1

LexToken lex_scan(LexState *ls,TValue *tv)

{
  SBuf *sb;
  LexChar LVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  char *pcVar6;
  GCstr *pGVar7;
  ulong uVar8;
  byte *pbVar9;
  byte bVar10;
  ErrMsg em;
  LexToken tok;
  int iVar11;
  long lVar12;
  
  sb = &ls->sb;
  (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
  lVar12 = (long)ls->c;
  bVar10 = ""[lVar12 + 1];
  do {
    if ((char)bVar10 < '\0') {
      if ((bVar10 & 8) == 0) {
        do {
          LVar1 = ls->c;
          uVar2 = (ls->sb).p.ptr32;
          pcVar6 = (char *)(ulong)uVar2;
          if ((ls->sb).e.ptr32 == uVar2) {
            pcVar6 = lj_buf_more2(sb,1);
          }
          *pcVar6 = (char)LVar1;
          (ls->sb).p.ptr32 = (int)pcVar6 + 1;
          pbVar9 = (byte *)ls->p;
          if (pbVar9 < ls->pe) {
            ls->p = (char *)(pbVar9 + 1);
            uVar2 = (uint)*pbVar9;
          }
          else {
            uVar2 = lex_more(ls);
          }
          ls->c = uVar2;
        } while ((char)""[(long)(int)uVar2 + 1] < '\0');
        uVar2 = (ls->sb).b.ptr32;
        pGVar7 = lj_parse_keepstr(ls,(char *)(ulong)uVar2,(ulong)((ls->sb).p.ptr32 - uVar2));
        (tv->u32).lo = (uint32_t)pGVar7;
        (tv->field_2).it = 0xfffffffb;
        if (pGVar7->reserved == 0) {
          uVar2 = 0x11f;
        }
        else {
          uVar2 = pGVar7->reserved | 0x100;
        }
      }
      else {
LAB_0012a06e:
        lex_number(ls,tv);
        uVar2 = 0x11e;
      }
      return uVar2;
    }
    uVar2 = (uint)lVar12;
    if ((int)uVar2 < 0xd) {
      if (((int)uVar2 < 0xb) && (uVar2 != 9)) {
        if (uVar2 != 10) {
          if (uVar2 == 0xffffffff) {
            return 0x121;
          }
          goto switchD_00129748_caseD_3b;
        }
LAB_001295c8:
        lex_newline(ls);
      }
      else {
LAB_001295a1:
        pbVar9 = (byte *)ls->p;
        if (pbVar9 < ls->pe) {
          ls->p = (char *)(pbVar9 + 1);
          uVar2 = (uint)*pbVar9;
        }
        else {
          uVar2 = lex_more(ls);
        }
        ls->c = uVar2;
      }
    }
    else {
      if ((int)uVar2 < 0x27) {
        if (uVar2 != 0xd) {
          if (uVar2 != 0x20) {
            if (uVar2 != 0x22) goto switchD_00129748_caseD_3b;
            goto LAB_001297cd;
          }
          goto LAB_001295a1;
        }
        goto LAB_001295c8;
      }
      if (0x2d < (int)uVar2) {
        if ((int)uVar2 < 0x5b) {
          switch(uVar2) {
          case 0x3a:
            pbVar9 = (byte *)ls->p;
            if (pbVar9 < ls->pe) {
              ls->p = (char *)(pbVar9 + 1);
              uVar2 = (uint)*pbVar9;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3a) {
              pbVar9 = (byte *)ls->p;
              if (pbVar9 < ls->pe) {
                ls->p = (char *)(pbVar9 + 1);
                uVar2 = (uint)*pbVar9;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x11d;
            }
            return 0x3a;
          case 0x3b:
            break;
          case 0x3c:
            pbVar9 = (byte *)ls->p;
            if (pbVar9 < ls->pe) {
              ls->p = (char *)(pbVar9 + 1);
              uVar2 = (uint)*pbVar9;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3d) {
              pbVar9 = (byte *)ls->p;
              if (pbVar9 < ls->pe) {
                ls->p = (char *)(pbVar9 + 1);
                uVar2 = (uint)*pbVar9;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x11b;
            }
            return 0x3c;
          case 0x3d:
            pbVar9 = (byte *)ls->p;
            if (pbVar9 < ls->pe) {
              ls->p = (char *)(pbVar9 + 1);
              uVar2 = (uint)*pbVar9;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3d) {
              pbVar9 = (byte *)ls->p;
              if (pbVar9 < ls->pe) {
                ls->p = (char *)(pbVar9 + 1);
                uVar2 = (uint)*pbVar9;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x119;
            }
            return 0x3d;
          case 0x3e:
            pbVar9 = (byte *)ls->p;
            if (pbVar9 < ls->pe) {
              ls->p = (char *)(pbVar9 + 1);
              uVar2 = (uint)*pbVar9;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3d) {
              pbVar9 = (byte *)ls->p;
              if (pbVar9 < ls->pe) {
                ls->p = (char *)(pbVar9 + 1);
                uVar2 = (uint)*pbVar9;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x11a;
            }
            return 0x3e;
          default:
            if (uVar2 == 0x2e) {
              uVar2 = (ls->sb).p.ptr32;
              pcVar6 = (char *)(ulong)uVar2;
              if ((ls->sb).e.ptr32 == uVar2) {
                pcVar6 = lj_buf_more2(sb,1);
              }
              *pcVar6 = (char)lVar12;
              (ls->sb).p.ptr32 = (int)pcVar6 + 1;
              pbVar9 = (byte *)ls->p;
              if (pbVar9 < ls->pe) {
                ls->p = (char *)(pbVar9 + 1);
                uVar2 = (uint)*pbVar9;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              if (uVar2 == 0x2e) {
                pbVar9 = (byte *)ls->p;
                if (pbVar9 < ls->pe) {
                  ls->p = (char *)(pbVar9 + 1);
                  uVar2 = (uint)*pbVar9;
                }
                else {
                  uVar2 = lex_more(ls);
                }
                ls->c = uVar2;
                if (uVar2 == 0x2e) {
                  pbVar9 = (byte *)ls->p;
                  if (pbVar9 < ls->pe) {
                    ls->p = (char *)(pbVar9 + 1);
                    uVar2 = (uint)*pbVar9;
                  }
                  else {
                    uVar2 = lex_more(ls);
                  }
                  ls->c = uVar2;
                  return 0x118;
                }
                return 0x117;
              }
              if ((""[(long)(int)uVar2 + 1] & 8) == 0) {
                return 0x2e;
              }
              goto LAB_0012a06e;
            }
          }
        }
        else {
          if (uVar2 == 0x5b) {
            iVar11 = lex_skipeq(ls);
            if (-1 < iVar11) {
              lex_longstring(ls,tv,iVar11);
              return 0x120;
            }
            if (iVar11 == -1) {
              return 0x5b;
            }
            tok = 0x120;
            em = LJ_ERR_XLDELIM;
            goto LAB_0012a1bf;
          }
          if (uVar2 == 0x7e) {
            pbVar9 = (byte *)ls->p;
            if (pbVar9 < ls->pe) {
              ls->p = (char *)(pbVar9 + 1);
              uVar2 = (uint)*pbVar9;
            }
            else {
              uVar2 = lex_more(ls);
            }
            ls->c = uVar2;
            if (uVar2 == 0x3d) {
              pbVar9 = (byte *)ls->p;
              if (pbVar9 < ls->pe) {
                ls->p = (char *)(pbVar9 + 1);
                uVar2 = (uint)*pbVar9;
              }
              else {
                uVar2 = lex_more(ls);
              }
              ls->c = uVar2;
              return 0x11c;
            }
            return 0x7e;
          }
        }
switchD_00129748_caseD_3b:
        pbVar9 = (byte *)ls->p;
        if (pbVar9 < ls->pe) {
          ls->p = (char *)(pbVar9 + 1);
          uVar5 = (uint)*pbVar9;
        }
        else {
          uVar5 = lex_more(ls);
        }
        ls->c = uVar5;
        return uVar2;
      }
      if (uVar2 != 0x2d) {
        if (uVar2 != 0x27) goto switchD_00129748_caseD_3b;
LAB_001297cd:
        uVar5 = (ls->sb).p.ptr32;
        pcVar6 = (char *)(ulong)uVar5;
        if ((ls->sb).e.ptr32 == uVar5) {
          pcVar6 = lj_buf_more2(sb,1);
        }
        *pcVar6 = (char)lVar12;
        (ls->sb).p.ptr32 = (int)pcVar6 + 1;
        pbVar9 = (byte *)ls->p;
        if (pbVar9 < ls->pe) {
          ls->p = (char *)(pbVar9 + 1);
          uVar5 = (uint)*pbVar9;
        }
        else {
          uVar5 = lex_more(ls);
        }
        ls->c = uVar5;
        break;
      }
      pbVar9 = (byte *)ls->p;
      if (pbVar9 < ls->pe) {
        ls->p = (char *)(pbVar9 + 1);
        uVar2 = (uint)*pbVar9;
      }
      else {
        uVar2 = lex_more(ls);
      }
      ls->c = uVar2;
      if (uVar2 != 0x2d) {
        return 0x2d;
      }
      pbVar9 = (byte *)ls->p;
      if (pbVar9 < ls->pe) {
        ls->p = (char *)(pbVar9 + 1);
        uVar2 = (uint)*pbVar9;
      }
      else {
        uVar2 = lex_more(ls);
      }
      ls->c = uVar2;
      if (uVar2 == 0x5b) {
        iVar11 = lex_skipeq(ls);
        (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
        if (-1 < iVar11) {
          lex_longstring(ls,(TValue *)0x0,iVar11);
          (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
          goto LAB_0012968e;
        }
      }
      while ((uVar2 = ls->c + 1, 0xe < uVar2 || ((0x4801U >> (uVar2 & 0x1f) & 1) == 0))) {
        pbVar9 = (byte *)ls->p;
        if (pbVar9 < ls->pe) {
          ls->p = (char *)(pbVar9 + 1);
          uVar2 = (uint)*pbVar9;
        }
        else {
          uVar2 = lex_more(ls);
        }
        ls->c = uVar2;
      }
    }
LAB_0012968e:
    lVar12 = (long)ls->c;
    bVar10 = ""[lVar12 + 1];
  } while( true );
LAB_001298c6:
  if (uVar5 == uVar2) {
    uVar2 = (ls->sb).p.ptr32;
    pcVar6 = (char *)(ulong)uVar2;
    if ((ls->sb).e.ptr32 == uVar2) {
      pcVar6 = lj_buf_more2(sb,1);
    }
    *pcVar6 = (char)uVar5;
    (ls->sb).p.ptr32 = (int)pcVar6 + 1;
    pbVar9 = (byte *)ls->p;
    if (pbVar9 < ls->pe) {
      ls->p = (char *)(pbVar9 + 1);
      uVar2 = (uint)*pbVar9;
    }
    else {
      uVar2 = lex_more(ls);
    }
    ls->c = uVar2;
    uVar2 = (ls->sb).b.ptr32;
    pGVar7 = lj_parse_keepstr(ls,(char *)((ulong)uVar2 + 1),(ulong)(((ls->sb).p.ptr32 - uVar2) - 2))
    ;
    (tv->u32).lo = (uint32_t)pGVar7;
    (tv->field_2).it = 0xfffffffb;
    return 0x120;
  }
  if ((int)uVar5 < 0x5c) {
    if (uVar5 == 0xffffffff) {
      tok = 0x121;
    }
    else {
      if ((uVar5 != 10) && (uVar5 != 0xd)) goto LAB_0012990c;
      tok = 0x120;
    }
    em = LJ_ERR_XSTR;
LAB_0012a1bf:
    lj_lex_error(ls,tok,em);
  }
  if (uVar5 != 0x5c) {
LAB_0012990c:
    uVar3 = (ls->sb).p.ptr32;
    pcVar6 = (char *)(ulong)uVar3;
    if ((ls->sb).e.ptr32 == uVar3) {
      pcVar6 = lj_buf_more2(sb,1);
    }
    iVar11 = (int)pcVar6;
    *pcVar6 = (char)uVar5;
    goto LAB_00129d99;
  }
  pbVar9 = (byte *)ls->p;
  if (pbVar9 < ls->pe) {
    ls->p = (char *)(pbVar9 + 1);
    uVar5 = (uint)*pbVar9;
  }
  else {
    uVar5 = lex_more(ls);
  }
  ls->c = uVar5;
  if ((int)uVar5 < 0x62) {
    if (0x21 < (int)uVar5) {
      if ((int)uVar5 < 0x5c) {
        if ((uVar5 != 0x22) && (uVar5 != 0x27)) goto switchD_00129975_caseD_6f;
      }
      else if (uVar5 != 0x5c) {
        if (uVar5 != 0x61) goto switchD_00129975_caseD_6f;
        uVar5 = 7;
      }
      goto LAB_00129d8b;
    }
    if (uVar5 != 0xffffffff) {
      if ((uVar5 != 10) && (uVar5 != 0xd)) goto switchD_00129975_caseD_6f;
      uVar5 = (ls->sb).p.ptr32;
      pcVar6 = (char *)(ulong)uVar5;
      if ((ls->sb).e.ptr32 == uVar5) {
        pcVar6 = lj_buf_more2(sb,1);
      }
      *pcVar6 = '\n';
      (ls->sb).p.ptr32 = (int)pcVar6 + 1;
      lex_newline(ls);
    }
    goto LAB_00129dbe;
  }
  switch(uVar5) {
  case 0x6e:
    uVar5 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
  case 0x79:
switchD_00129975_caseD_6f:
    if ((""[(long)(int)uVar5 + 1] & 8) != 0) {
      pbVar9 = (byte *)ls->p;
      if (pbVar9 < ls->pe) {
        ls->p = (char *)(pbVar9 + 1);
        uVar3 = (uint)*pbVar9;
      }
      else {
        uVar3 = lex_more(ls);
      }
      iVar11 = uVar5 - 0x30;
      ls->c = uVar3;
      if ((""[(long)(int)uVar3 + 1] & 8) != 0) {
        pbVar9 = (byte *)ls->p;
        if (pbVar9 < ls->pe) {
          ls->p = (char *)(pbVar9 + 1);
          uVar5 = (uint)*pbVar9;
        }
        else {
          uVar5 = lex_more(ls);
        }
        iVar11 = (uVar3 - 0x30) + iVar11 * 10;
        ls->c = uVar5;
        if ((""[(long)(int)uVar5 + 1] & 8) != 0) {
          iVar11 = uVar5 + iVar11 * 10 + -0x30;
          if (0xff < iVar11) goto LAB_0012a199;
          pbVar9 = (byte *)ls->p;
          if (pbVar9 < ls->pe) {
            ls->p = (char *)(pbVar9 + 1);
            uVar5 = (uint)*pbVar9;
          }
          else {
            uVar5 = lex_more(ls);
          }
          ls->c = uVar5;
        }
      }
      uVar5 = (ls->sb).p.ptr32;
      pcVar6 = (char *)(ulong)uVar5;
      if ((ls->sb).e.ptr32 == uVar5) {
        pcVar6 = lj_buf_more2(sb,1);
      }
      *pcVar6 = (char)iVar11;
      (sb->p).ptr32 = (int)pcVar6 + 1;
      goto LAB_00129dbe;
    }
LAB_0012a199:
    tok = 0x120;
    em = LJ_ERR_XESC;
    goto LAB_0012a1bf;
  case 0x72:
    uVar5 = 0xd;
    break;
  case 0x74:
    uVar5 = 9;
    break;
  case 0x75:
    pbVar9 = (byte *)ls->p;
    if (pbVar9 < ls->pe) {
      ls->p = (char *)(pbVar9 + 1);
      uVar5 = (uint)*pbVar9;
    }
    else {
      uVar5 = lex_more(ls);
    }
    ls->c = uVar5;
    if (uVar5 != 0x7b) goto LAB_0012a199;
    pbVar9 = (byte *)ls->p;
    if (pbVar9 < ls->pe) {
      ls->p = (char *)(pbVar9 + 1);
      uVar5 = (uint)*pbVar9;
    }
    else {
      uVar5 = lex_more(ls);
    }
    ls->c = uVar5;
    uVar5 = 0;
    do {
      uVar5 = ls->c & 0xfU | uVar5 << 4;
      if ((""[(long)ls->c + 1] & 8) == 0) {
        if ((""[(long)ls->c + 1] & 0x10) == 0) goto LAB_0012a199;
        uVar5 = uVar5 + 9;
      }
      if (0x10ffff < (int)uVar5) goto LAB_0012a199;
      pbVar9 = (byte *)ls->p;
      if (pbVar9 < ls->pe) {
        ls->p = (char *)(pbVar9 + 1);
        uVar3 = (uint)*pbVar9;
      }
      else {
        uVar3 = lex_more(ls);
      }
      ls->c = uVar3;
    } while (uVar3 != 0x7d);
    if ((int)uVar5 < 0x800) {
      if ((int)uVar5 < 0x80) break;
      uVar3 = (ls->sb).p.ptr32;
      pbVar9 = (byte *)(ulong)uVar3;
      if ((ls->sb).e.ptr32 == uVar3) {
        pbVar9 = (byte *)lj_buf_more2(sb,1);
      }
      bVar10 = (byte)(uVar5 >> 6) | 0xc0;
    }
    else {
      if ((int)uVar5 < 0x10000) {
        if ((uVar5 & 0x7ffff800) == 0xd800) goto LAB_0012a199;
        uVar3 = (ls->sb).p.ptr32;
        pbVar9 = (byte *)(ulong)uVar3;
        if ((ls->sb).e.ptr32 == uVar3) {
          pbVar9 = (byte *)lj_buf_more2(sb,1);
        }
        bVar10 = (byte)(uVar5 >> 0xc) | 0xe0;
      }
      else {
        uVar3 = (ls->sb).p.ptr32;
        pbVar9 = (byte *)(ulong)uVar3;
        if ((ls->sb).e.ptr32 == uVar3) {
          pbVar9 = (byte *)lj_buf_more2(sb,1);
        }
        *pbVar9 = (byte)(uVar5 >> 0x12) | 0xf0;
        uVar4 = (uint32_t)(pbVar9 + 1);
        (ls->sb).p.ptr32 = uVar4;
        if ((ls->sb).e.ptr32 == uVar4) {
          pbVar9 = (byte *)lj_buf_more2(sb,1);
        }
        else {
          pbVar9 = (byte *)((ulong)(pbVar9 + 1) & 0xffffffff);
        }
        bVar10 = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
      }
      *pbVar9 = bVar10;
      uVar4 = (uint32_t)(pbVar9 + 1);
      (ls->sb).p.ptr32 = uVar4;
      if ((ls->sb).e.ptr32 == uVar4) {
        pbVar9 = (byte *)lj_buf_more2(sb,1);
      }
      else {
        pbVar9 = (byte *)((ulong)(pbVar9 + 1) & 0xffffffff);
      }
      bVar10 = (byte)(uVar5 >> 6) & 0x3f | 0x80;
    }
    *pbVar9 = bVar10;
    (sb->p).ptr32 = (int)pbVar9 + 1;
    uVar5 = uVar5 & 0x3f | 0x80;
    break;
  case 0x76:
    uVar5 = 0xb;
    break;
  case 0x78:
    pbVar9 = (byte *)ls->p;
    if (pbVar9 < ls->pe) {
      ls->p = (char *)(pbVar9 + 1);
      uVar5 = (uint)*pbVar9;
    }
    else {
      uVar5 = lex_more(ls);
    }
    ls->c = uVar5;
    iVar11 = (uVar5 & 0xf) * 0x10;
    if ((""[(long)(int)uVar5 + 1] & 8) == 0) {
      if ((""[(long)(int)uVar5 + 1] & 0x10) == 0) goto LAB_0012a199;
      iVar11 = iVar11 + 0x90;
    }
    pbVar9 = (byte *)ls->p;
    if (pbVar9 < ls->pe) {
      ls->p = (char *)(pbVar9 + 1);
      uVar3 = (uint)*pbVar9;
    }
    else {
      uVar3 = lex_more(ls);
    }
    ls->c = uVar3;
    uVar5 = (uVar3 & 0xf) + iVar11;
    if ((""[(long)(int)uVar3 + 1] & 8) == 0) {
      if ((""[(long)(int)uVar3 + 1] & 0x10) == 0) goto LAB_0012a199;
      uVar5 = uVar5 + 9;
    }
    break;
  case 0x7a:
    pbVar9 = (byte *)ls->p;
    if (pbVar9 < ls->pe) {
      ls->p = (char *)(pbVar9 + 1);
      uVar8 = (ulong)*pbVar9;
    }
    else {
      uVar5 = lex_more(ls);
      uVar8 = (ulong)uVar5;
    }
    ls->c = (int)uVar8;
    bVar10 = ""[(long)(int)uVar8 + 1];
    while ((bVar10 & 2) != 0) {
      if (((int)uVar8 == 0xd) || ((int)uVar8 == 10)) {
        lex_newline(ls);
      }
      else {
        pbVar9 = (byte *)ls->p;
        if (pbVar9 < ls->pe) {
          ls->p = (char *)(pbVar9 + 1);
          uVar5 = (uint)*pbVar9;
        }
        else {
          uVar5 = lex_more(ls);
        }
        ls->c = uVar5;
      }
      uVar8 = (ulong)ls->c;
      bVar10 = ""[uVar8 + 1];
    }
    goto LAB_00129dbe;
  default:
    if (uVar5 == 0x62) {
      uVar5 = 8;
    }
    else {
      if (uVar5 != 0x66) goto switchD_00129975_caseD_6f;
      uVar5 = 0xc;
    }
  }
LAB_00129d8b:
  uVar3 = (ls->sb).p.ptr32;
  pcVar6 = (char *)(ulong)uVar3;
  if ((ls->sb).e.ptr32 == uVar3) {
    pcVar6 = lj_buf_more2(sb,1);
  }
  iVar11 = (int)pcVar6;
  *pcVar6 = (char)uVar5;
LAB_00129d99:
  (ls->sb).p.ptr32 = iVar11 + 1;
  pbVar9 = (byte *)ls->p;
  if (pbVar9 < ls->pe) {
    ls->p = (char *)(pbVar9 + 1);
    uVar5 = (uint)*pbVar9;
  }
  else {
    uVar5 = lex_more(ls);
  }
  ls->c = uVar5;
LAB_00129dbe:
  uVar5 = ls->c;
  goto LAB_001298c6;
}

Assistant:

static LexToken lex_scan(LexState *ls, TValue *tv)
{
  lj_buf_reset(&ls->sb);
  for (;;) {
    if (lj_char_isident(ls->c)) {
      GCstr *s;
      if (lj_char_isdigit(ls->c)) {  /* Numeric literal. */
	lex_number(ls, tv);
	return TK_number;
      }
      /* Identifier or reserved word. */
      do {
	lex_savenext(ls);
      } while (lj_char_isident(ls->c));
      s = lj_parse_keepstr(ls, sbufB(&ls->sb), sbuflen(&ls->sb));
      setstrV(ls->L, tv, s);
      if (s->reserved > 0)  /* Reserved word? */
	return TK_OFS + s->reserved;
      return TK_name;
    }
    switch (ls->c) {
    case '\n':
    case '\r':
      lex_newline(ls);
      continue;
    case ' ':
    case '\t':
    case '\v':
    case '\f':
      lex_next(ls);
      continue;
    case '-':
      lex_next(ls);
      if (ls->c != '-') return '-';
      lex_next(ls);
      if (ls->c == '[') {  /* Long comment "--[=*[...]=*]". */
	int sep = lex_skipeq(ls);
	lj_buf_reset(&ls->sb);  /* `lex_skipeq' may dirty the buffer */
	if (sep >= 0) {
	  lex_longstring(ls, NULL, sep);
	  lj_buf_reset(&ls->sb);
	  continue;
	}
      }
      /* Short comment "--.*\n". */
      while (!lex_iseol(ls) && ls->c != LEX_EOF)
	lex_next(ls);
      continue;
    case '[': {
      int sep = lex_skipeq(ls);
      if (sep >= 0) {
	lex_longstring(ls, tv, sep);
	return TK_string;
      } else if (sep == -1) {
	return '[';
      } else {
	lj_lex_error(ls, TK_string, LJ_ERR_XLDELIM);
	continue;
      }
      }
    case '=':
      lex_next(ls);
      if (ls->c != '=') return '='; else { lex_next(ls); return TK_eq; }
    case '<':
      lex_next(ls);
      if (ls->c != '=') return '<'; else { lex_next(ls); return TK_le; }
    case '>':
      lex_next(ls);
      if (ls->c != '=') return '>'; else { lex_next(ls); return TK_ge; }
    case '~':
      lex_next(ls);
      if (ls->c != '=') return '~'; else { lex_next(ls); return TK_ne; }
    case ':':
      lex_next(ls);
      if (ls->c != ':') return ':'; else { lex_next(ls); return TK_label; }
    case '"':
    case '\'':
      lex_string(ls, tv);
      return TK_string;
    case '.':
      if (lex_savenext(ls) == '.') {
	lex_next(ls);
	if (ls->c == '.') {
	  lex_next(ls);
	  return TK_dots;   /* ... */
	}
	return TK_concat;   /* .. */
      } else if (!lj_char_isdigit(ls->c)) {
	return '.';
      } else {
	lex_number(ls, tv);
	return TK_number;
      }
    case LEX_EOF:
      return TK_eof;
    default: {
      LexChar c = ls->c;
      lex_next(ls);
      return c;  /* Single-char tokens (+ - / ...). */
    }
    }
  }
}